

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugHookIdInfo(ImGuiID id,ImGuiDataType data_type,void *data_id,void *data_id_end)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  uint *puVar4;
  ImGuiStackLevelInfo *pIVar5;
  size_t sVar6;
  long in_RCX;
  char *in_RDX;
  undefined4 in_ESI;
  uint in_EDI;
  ImGuiStackLevelInfo *info;
  int n;
  ImGuiIDStackTool *tool;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined8 in_stack_ffffffffffffff58;
  int new_size;
  char *buf;
  ImVector<ImGuiStackLevelInfo> *in_stack_ffffffffffffff60;
  uint local_94;
  int local_74;
  
  pIVar2 = GImGui;
  new_size = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  pIVar1 = GImGui->CurrentWindow;
  if ((GImGui->DebugIDStackTool).StackLevel == -1) {
    (GImGui->DebugIDStackTool).StackLevel = (GImGui->DebugIDStackTool).StackLevel + 1;
    ImGuiStackLevelInfo::ImGuiStackLevelInfo((ImGuiStackLevelInfo *)0x1f90d4);
    ImVector<ImGuiStackLevelInfo>::resize
              (in_stack_ffffffffffffff60,new_size,
               (ImGuiStackLevelInfo *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
    ;
    for (local_74 = 0; local_74 < (pIVar1->IDStack).Size + 1; local_74 = local_74 + 1) {
      local_94 = in_EDI;
      if (local_74 < (pIVar1->IDStack).Size) {
        puVar4 = ImVector<unsigned_int>::operator[](&pIVar1->IDStack,local_74);
        local_94 = *puVar4;
      }
      pIVar5 = ImVector<ImGuiStackLevelInfo>::operator[]
                         (&(pIVar2->DebugIDStackTool).Results,local_74);
      pIVar5->ID = local_94;
    }
  }
  else if ((GImGui->DebugIDStackTool).StackLevel == (pIVar1->IDStack).Size) {
    pIVar5 = ImVector<ImGuiStackLevelInfo>::operator[]
                       (&(GImGui->DebugIDStackTool).Results,(GImGui->DebugIDStackTool).StackLevel);
    switch(in_ESI) {
    case 4:
      ImFormatString(pIVar5->Desc,0x39,"%d",(ulong)in_RDX & 0xffffffff);
      break;
    default:
      break;
    case 0xc:
      buf = pIVar5->Desc;
      if (in_RCX == 0) {
        sVar6 = strlen(in_RDX);
        uVar3 = (uint)sVar6;
      }
      else {
        uVar3 = (int)in_RCX - (int)in_RDX;
      }
      ImFormatString(buf,0x39,"%.*s",(ulong)uVar3,in_RDX);
      break;
    case 0xd:
      ImFormatString(pIVar5->Desc,0x39,"(void*)0x%p",in_RDX);
      break;
    case 0xe:
      if (pIVar5->Desc[0] != '\0') {
        return;
      }
      ImFormatString(pIVar5->Desc,0x39,"0x%08X [override]",(ulong)in_EDI);
    }
    pIVar5->QuerySuccess = true;
    pIVar5->field_0x6 = (char)in_ESI;
  }
  return;
}

Assistant:

void ImGui::DebugHookIdInfo(ImGuiID id, ImGuiDataType data_type, const void* data_id, const void* data_id_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiIDStackTool* tool = &g.DebugIDStackTool;

    // Step 0: stack query
    // This assumes that the ID was computed with the current ID stack, which tends to be the case for our widget.
    if (tool->StackLevel == -1)
    {
        tool->StackLevel++;
        tool->Results.resize(window->IDStack.Size + 1, ImGuiStackLevelInfo());
        for (int n = 0; n < window->IDStack.Size + 1; n++)
            tool->Results[n].ID = (n < window->IDStack.Size) ? window->IDStack[n] : id;
        return;
    }

    // Step 1+: query for individual level
    IM_ASSERT(tool->StackLevel >= 0);
    if (tool->StackLevel != window->IDStack.Size)
        return;
    ImGuiStackLevelInfo* info = &tool->Results[tool->StackLevel];
    IM_ASSERT(info->ID == id && info->QueryFrameCount > 0);

    switch (data_type)
    {
    case ImGuiDataType_S32:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%d", (int)(intptr_t)data_id);
        break;
    case ImGuiDataType_String:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "%.*s", data_id_end ? (int)((const char*)data_id_end - (const char*)data_id) : (int)strlen((const char*)data_id), (const char*)data_id);
        break;
    case ImGuiDataType_Pointer:
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "(void*)0x%p", data_id);
        break;
    case ImGuiDataType_ID:
        if (info->Desc[0] != 0) // PushOverrideID() is often used to avoid hashing twice, which would lead to 2 calls to DebugHookIdInfo(). We prioritize the first one.
            return;
        ImFormatString(info->Desc, IM_ARRAYSIZE(info->Desc), "0x%08X [override]", id);
        break;
    default:
        IM_ASSERT(0);
    }
    info->QuerySuccess = true;
    info->DataType = data_type;
}